

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::AddInputCharactersUTF8(ImGuiIO *this,char *utf8_chars)

{
  int iVar1;
  char *in_RSI;
  ImVector<unsigned_short> *in_RDI;
  uint c;
  unsigned_short *in_stack_ffffffffffffffd8;
  uint local_14;
  char *local_10;
  
  local_10 = in_RSI;
  while (*local_10 != '\0') {
    local_14 = 0;
    iVar1 = ImTextCharFromUtf8(&local_14,local_10,(char *)0x0);
    local_10 = local_10 + iVar1;
    if (local_14 != 0) {
      ImVector<unsigned_short>::push_back(in_RDI,in_stack_ffffffffffffffd8);
    }
  }
  return;
}

Assistant:

void ImGuiIO::AddInputCharactersUTF8(const char* utf8_chars)
{
    while (*utf8_chars != 0)
    {
        unsigned int c = 0;
        utf8_chars += ImTextCharFromUtf8(&c, utf8_chars, NULL);
        if (c != 0)
            InputQueueCharacters.push_back((ImWchar)c);
    }
}